

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qevdevtabletmanager.cpp
# Opt level: O3

void __thiscall QEvdevTabletManager::~QEvdevTabletManager(QEvdevTabletManager *this)

{
  Data *pDVar1;
  
  *(undefined ***)this = &PTR_metaObject_0010d570;
  std::
  vector<QtInputSupport::DeviceHandlerList<QEvdevTabletHandlerThread>::Device,_std::allocator<QtInputSupport::DeviceHandlerList<QEvdevTabletHandlerThread>::Device>_>
  ::~vector(&(this->m_activeDevices).v);
  pDVar1 = (this->m_spec).d.d;
  if (pDVar1 != (Data *)0x0) {
    LOCK();
    (pDVar1->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         (pDVar1->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if ((pDVar1->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(&((this->m_spec).d.d)->super_QArrayData,2,0x10);
    }
  }
  QObject::~QObject(&this->super_QObject);
  return;
}

Assistant:

QEvdevTabletManager::~QEvdevTabletManager()
{
}